

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmInfo.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmMultiAdapterContext::AddContext
          (GmmMultiAdapterContext *this,PLATFORM Platform,void *_pSkuTable,void *_pWaTable,
          void *_pGtSysInfo,ADAPTER_BDF sBdf,GMM_CLIENT ClientType)

{
  GMM_STATUS GVar1;
  GMM_ADAPTER_INFO *pGVar2;
  Context *this_00;
  size_t size;
  PLATFORM *Platform_00;
  Context *local_a0;
  GMM_STATUS SyncLockStatus;
  GMM_ADAPTER_INFO *pNode;
  GMM_LIB_CONTEXT *pGmmLibContext;
  GT_SYSTEM_INFO *pSysInfo;
  WA_TABLE *pWaTable;
  SKU_FEATURE_TABLE *pSkuTable;
  GMM_STATUS Status;
  GMM_CLIENT ClientType_local;
  void *_pGtSysInfo_local;
  void *_pWaTable_local;
  void *_pSkuTable_local;
  GmmMultiAdapterContext *this_local;
  ADAPTER_BDF sBdf_local;
  
  Platform_00 = &Platform;
  if (_pSkuTable == (void *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else if (_pWaTable == (void *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else if (_pGtSysInfo == (void *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else {
    this_local._4_4_ = LockMAContextSyncMutex(this);
    if (this_local._4_4_ == GMM_SUCCESS) {
      size = (size_t)(uint)sBdf.field_0;
      pGVar2 = GetAdapterNodeUnlocked(this,sBdf);
      if (pGVar2 == (GMM_ADAPTER_INFO *)0x0) {
        pGVar2 = AddAdapterNode(this);
        if (pGVar2 == (GMM_ADAPTER_INFO *)0x0) {
          UnLockMAContextSyncMutex(this);
          this_local._4_4_ = GMM_ERROR;
        }
        else {
          this_00 = (Context *)GmmMemAllocator::operator_new((GmmMemAllocator *)0x36b0,size);
          local_a0 = (Context *)0x0;
          if (this_00 != (Context *)0x0) {
            Context::Context(this_00);
            local_a0 = this_00;
          }
          if (local_a0 == (Context *)0x0) {
            RemoveAdapterNode(this,pGVar2);
            UnLockMAContextSyncMutex(this);
            this_local._4_4_ = GMM_ERROR;
          }
          else {
            Context::IncrementRefCount(local_a0);
            GVar1 = Context::InitContext
                              (local_a0,Platform_00,(SKU_FEATURE_TABLE *)_pSkuTable,
                               (WA_TABLE *)_pWaTable,(GT_SYSTEM_INFO *)_pGtSysInfo,ClientType);
            if (GVar1 == GMM_SUCCESS) {
              (local_a0->sBdf).field_0.field_0 =
                   (anon_struct_4_4_a1e812c5_for_anon_union_4_2_d56df3a2_for__ADAPTER_BDF__0_0)
                   sBdf.field_0;
              pGVar2->pGmmLibContext = local_a0;
              UnLockMAContextSyncMutex(this);
              this_local._4_4_ = GMM_SUCCESS;
            }
            else {
              Context::DecrementRefCount(local_a0);
              Context::DestroyContext(local_a0);
              if (local_a0 != (Context *)0x0) {
                Context::~Context(local_a0);
                GmmMemAllocator::operator_delete((GmmMemAllocator *)local_a0,Platform_00);
              }
              RemoveAdapterNode(this,pGVar2);
              UnLockMAContextSyncMutex(this);
              this_local._4_4_ = GMM_ERROR;
            }
          }
        }
      }
      else {
        Context::IncrementRefCount(pGVar2->pGmmLibContext);
        UnLockMAContextSyncMutex(this);
        this_local._4_4_ = GMM_SUCCESS;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmMultiAdapterContext::AddContext(const PLATFORM Platform,
                                                                  const void    *_pSkuTable,
                                                                  const void    *_pWaTable,
                                                                  const void    *_pGtSysInfo,
                                                                  ADAPTER_BDF    sBdf,
                                                                  const GMM_CLIENT ClientType)
#endif
{
    __GMM_ASSERTPTR(_pSkuTable, GMM_ERROR);
    __GMM_ASSERTPTR(_pWaTable, GMM_ERROR);
    __GMM_ASSERTPTR(_pGtSysInfo, GMM_ERROR);

    GMM_STATUS                Status = GMM_SUCCESS;
    SKU_FEATURE_TABLE        *pSkuTable;
    WA_TABLE                 *pWaTable;
    GT_SYSTEM_INFO           *pSysInfo;
    GMM_LIB_CONTEXT          *pGmmLibContext = NULL;
    GmmLib::GMM_ADAPTER_INFO *pNode          = NULL;

    pSkuTable = (SKU_FEATURE_TABLE *)_pSkuTable;
    pWaTable  = (WA_TABLE *)_pWaTable;
    pSysInfo  = (GT_SYSTEM_INFO *)_pGtSysInfo;

    GMM_STATUS SyncLockStatus = LockMAContextSyncMutex();
    if (SyncLockStatus != GMM_SUCCESS)
    {
        return SyncLockStatus;
    }

    // see if a context with the given BDF already exists
    pNode = GetAdapterNodeUnlocked(sBdf);

    if (pNode)
    {
        // The requested adapter context already exists. increment the reference count.
        // No further initialization needed.
        pNode->pGmmLibContext->IncrementRefCount();
        UnLockMAContextSyncMutex();
        return GMM_SUCCESS;
    }

    // No context exists for this bdf. Add a new node to store the context.
    pNode = AddAdapterNode();
    if (pNode == NULL)
    {
        UnLockMAContextSyncMutex();
        return GMM_ERROR;
    }

    // No context for this adapter yet, Lets create a new LibContext
    pGmmLibContext = new GMM_LIB_CONTEXT();
    if (pGmmLibContext == NULL)
    {
        RemoveAdapterNode(pNode);
        pNode = NULL;
        UnLockMAContextSyncMutex();
        return GMM_ERROR;
    }

    pGmmLibContext->IncrementRefCount();

    Status = (pGmmLibContext->InitContext(Platform, pSkuTable, pWaTable, pSysInfo, ClientType));
    if (Status != GMM_SUCCESS)
    {
        //clean everything and return error
        pGmmLibContext->DecrementRefCount();
        pGmmLibContext->DestroyContext();
        // Delete/free the LibContext object
        delete pGmmLibContext;
        RemoveAdapterNode(pNode);
        UnLockMAContextSyncMutex();
        return GMM_ERROR;
    }

#if LHDM
    // Initialize SingletonContext Data.
    // TBD: ProcessHeap creation requires size and GfxAddress parameters. These parameters are constants
    // and are given by GMM lib internally by PageTableMgr. Hence pHeapObj should be created here at the
    // time of SingletonContext creation. But untill all UMD clients have moved to GMM DLL, then we will
    // create this here.
    pGmmLibContext->pHeapObj           = NULL;
    pGmmLibContext->ProcessHeapCounter = 0;

    // TBD: ProcessVA Gfx partition should be created here using VirtualAlloc at the time of SingletonContext
    // creation. But untill all UMD clients have moved to GMM DLL, then we will
    // create this here.
    pGmmLibContext->ProcessVA        = {0};
    pGmmLibContext->ProcessVACounter = 0;

    pGmmLibContext->IsSVMReserved      = 0;
    pGmmLibContext->NullCCSTileAddress = 0;
#endif

    pGmmLibContext->sBdf = sBdf;

    pNode->pGmmLibContext = pGmmLibContext;


    UnLockMAContextSyncMutex();

    return GMM_SUCCESS;
}